

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

IRIns * sink_checkalloc(jit_State *J,IRIns *irs)

{
  IRIns *local_28;
  IRIns *ir;
  IRIns *irs_local;
  jit_State *J_local;
  
  local_28 = (J->cur).ir + (irs->field_0).op1;
  if ((local_28->field_0).op2 < 0x8000) {
    if (((local_28->field_1).o == '9') || ((local_28->field_1).o == '8')) {
      local_28 = (J->cur).ir + (local_28->field_0).op1;
    }
    else if (((((local_28->field_1).o != ':') && ((local_28->field_1).o != ';')) &&
             ((local_28->field_1).o != '>')) && ((local_28->field_1).o != ')')) {
      return (IRIns *)0x0;
    }
    J_local = (jit_State *)((J->cur).ir + (local_28->field_0).op1);
    if (((((anon_struct_8_5_4e98db7e_for_IRIns_2 *)J_local)->o != 'Q') &&
        (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)J_local)->o != 'R')) &&
       (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)J_local)->o != 'S')) {
      J_local = (jit_State *)0x0;
    }
  }
  else {
    J_local = (jit_State *)0x0;
  }
  return (IRIns *)J_local;
}

Assistant:

static IRIns *sink_checkalloc(jit_State *J, IRIns *irs)
{
  IRIns *ir = IR(irs->op1);
  if (!irref_isk(ir->op2))
    return NULL;  /* Non-constant key. */
  if (ir->o == IR_HREFK || ir->o == IR_AREF)
    ir = IR(ir->op1);
  else if (!(ir->o == IR_HREF || ir->o == IR_NEWREF ||
	     ir->o == IR_FREF || ir->o == IR_ADD))
    return NULL;  /* Unhandled reference type (for XSTORE). */
  ir = IR(ir->op1);
  if (!(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW))
    return NULL;  /* Not an allocation. */
  return ir;  /* Return allocation. */
}